

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

Var Js::JavascriptOperators::OP_GetRootProperty
              (Var instance,PropertyId propertyId,PropertyValueInfo *info,
              ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  RecyclableObject *instance_00;
  ThreadContext *pTVar5;
  PropertyRecord *this;
  FunctionBody *this_00;
  Utf8SourceInfo *this_01;
  FunctionBody *callerBody;
  JavascriptFunction *caller;
  char16 *propertyName;
  Var value;
  ScriptContext *scriptContext_local;
  PropertyValueInfo *info_local;
  Var pvStack_18;
  PropertyId propertyId_local;
  Var instance_local;
  
  value = scriptContext;
  scriptContext_local = (ScriptContext *)info;
  info_local._4_4_ = propertyId;
  pvStack_18 = instance;
  bVar2 = VarIs<Js::RootObjectBase>(instance);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x87c,"(VarIs<RootObjectBase>(instance))","Root must be an object!"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  propertyName = (char16 *)0x0;
  instance_00 = VarTo<Js::RecyclableObject>(pvStack_18);
  BVar3 = GetRootProperty(instance_00,info_local._4_4_,&propertyName,(ScriptContext *)value,
                          (PropertyValueInfo *)scriptContext_local);
  if (BVar3 == 0) {
    this = ScriptContext::GetPropertyName((ScriptContext *)value,info_local._4_4_);
    caller = (JavascriptFunction *)PropertyRecord::GetBuffer(this);
    callerBody = (FunctionBody *)0x0;
    BVar3 = JavascriptStackWalker::GetCaller
                      ((JavascriptFunction **)&callerBody,(ScriptContext *)value);
    if ((BVar3 != 0) &&
       (this_00 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)callerBody),
       this_00 != (FunctionBody *)0x0)) {
      this_01 = FunctionProxy::GetUtf8SourceInfo((FunctionProxy *)this_00);
      bVar2 = Utf8SourceInfo::GetIsXDomain(this_01);
      if (bVar2) {
        caller = (JavascriptFunction *)0x0;
      }
    }
    pTVar5 = ScriptContext::GetThreadContext((ScriptContext *)value);
    bVar2 = ThreadContext::RecordImplicitException(pTVar5);
    if (bVar2) {
      JavascriptError::ThrowReferenceError((ScriptContext *)value,-0x7ff5ec6f,(PCWSTR)caller);
    }
    instance_local = ScriptContext::GetMissingPropertyResult((ScriptContext *)value);
  }
  else {
    bVar2 = ScriptContext::IsUndeclBlockVar((ScriptContext *)value,propertyName);
    if (bVar2) {
      pTVar5 = ScriptContext::GetThreadContext((ScriptContext *)value);
      bVar2 = ThreadContext::RecordImplicitException(pTVar5);
      if (bVar2) {
        JavascriptError::ThrowReferenceError((ScriptContext *)value,-0x7ff5ec07,(PCWSTR)0x0);
      }
    }
    instance_local = propertyName;
  }
  return instance_local;
}

Assistant:

Var JavascriptOperators::OP_GetRootProperty(Var instance, PropertyId propertyId, PropertyValueInfo * info, ScriptContext* scriptContext)
    {
        AssertMsg(VarIs<RootObjectBase>(instance), "Root must be an object!");

        Var value = nullptr;
        if (JavascriptOperators::GetRootProperty(VarTo<RecyclableObject>(instance), propertyId, &value, scriptContext, info))
        {
            if (scriptContext->IsUndeclBlockVar(value) && scriptContext->GetThreadContext()->RecordImplicitException())
            {
                JavascriptError::ThrowReferenceError(scriptContext, JSERR_UseBeforeDeclaration);
            }
            return value;
        }

        const char16* propertyName = scriptContext->GetPropertyName(propertyId)->GetBuffer();

        JavascriptFunction * caller = nullptr;
        if (JavascriptStackWalker::GetCaller(&caller, scriptContext))
        {
            FunctionBody * callerBody = caller->GetFunctionBody();
            if (callerBody && callerBody->GetUtf8SourceInfo()->GetIsXDomain())
            {
                propertyName = nullptr;
            }
        }

        // Don't error if we disabled implicit calls
        if (scriptContext->GetThreadContext()->RecordImplicitException())
        {
            JavascriptError::ThrowReferenceError(scriptContext, JSERR_UndefVariable, propertyName);
        }

        return scriptContext->GetMissingPropertyResult();
    }